

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  idx_t iVar6;
  unsigned_long uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  uhugeint_t *this_00;
  uhugeint_t min_value;
  uhugeint_t local_48;
  
  bVar8 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) &&
        (bVar3 = uhugeint_t::operator==(&this->maximum,&this->minimum), !bVar3)) ||
       (1 < (byte)(this->mode - AUTO))) {
      bVar3 = TrySubtractOperator::
              Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (this->maximum,this->minimum,&this->min_max_diff);
      this->can_do_for = bVar3;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        bVar3 = hugeint_t::operator==(&this->maximum_delta,&this->minimum_delta);
        if ((bVar3) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 0x24;
          return true;
        }
        min_value = hugeint_t::operator_cast_to_uhugeint_t(&this->min_max_delta_diff);
        bVar4 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
                          (min_value,min_value);
        bVar5 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
                          (this->min_max_diff,this->min_max_diff);
        if ((bVar4 < bVar5) && (this->mode != FOR)) {
          SubtractFrameOfReference<duckdb::hugeint_t>(this,this->delta_buffer,this->minimum_delta);
          hugeint_t::operator_cast_to_uhugeint_t(&this->minimum_delta);
          uVar10 = this->compression_buffer_idx;
          iVar6 = this->total_size + 0x28;
          this->total_size = iVar6;
          if ((uVar10 & 0x1f) != 0) {
            uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
            uVar10 = (uVar10 - uVar7) + 0x20;
            iVar6 = this->total_size;
          }
          this->total_size = (bVar4 * uVar10 >> 3) + iVar6;
          return true;
        }
      }
      if (this->can_do_for == true) {
        bVar4 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
                          (this->min_max_diff,this->min_max_diff);
        if (this->compression_buffer_idx == 0) {
          uVar10 = 0;
        }
        else {
          this_00 = this->compression_buffer;
          uVar1 = (this->minimum).lower;
          uVar2 = (this->minimum).upper;
          uVar9 = 0;
          do {
            local_48.lower = uVar1;
            local_48.upper = uVar2;
            uhugeint_t::operator-=(this_00,&local_48);
            uVar9 = uVar9 + 1;
            uVar10 = this->compression_buffer_idx;
            this_00 = this_00 + 1;
          } while (uVar9 < uVar10);
          if ((uVar10 & 0x1f) != 0) {
            uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
            uVar10 = (uVar10 - uVar7) + 0x20;
          }
        }
        this->total_size = (bVar4 * uVar10 >> 3) + this->total_size + 0x18;
      }
      else {
        bVar8 = false;
      }
    }
    else {
      this->total_size = this->total_size + 0x14;
    }
  }
  return bVar8;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}